

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

Var Js::TypedArrayBase::GetKeysEntriesValuesHelper
              (Arguments *args,ScriptContext *scriptContext,LPCWSTR apiName,
              JavascriptArrayIteratorKind kind)

{
  code *pcVar1;
  bool bVar2;
  PropertyId n;
  _E propertyId;
  BOOL BVar3;
  TypedArrayBase *iterable;
  JavascriptLibrary *pJVar4;
  DynamicObject *instance;
  Var instance_00;
  undefined4 *puVar5;
  RecyclableObject *this;
  GlobalObject *instance_01;
  ThreadContext *threadContext;
  JavascriptMethod entryPoint;
  Arguments local_c0 [2];
  undefined1 local_a0 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  CallInfo callInfo;
  Var argsIt [3];
  Var chakraLibObj;
  RecyclableObject *function;
  Var scriptFunction;
  JavascriptString *pJStack_48;
  PropertyIds functionIdentifier;
  JavascriptString *methodName;
  JavascriptLibrary *library;
  TypedArrayBase *typedArrayBase;
  JavascriptArrayIteratorKind kind_local;
  LPCWSTR apiName_local;
  ScriptContext *scriptContext_local;
  Arguments *args_local;
  
  iterable = ValidateTypedArray(args,scriptContext,apiName);
  pJVar4 = ScriptContext::GetLibrary(scriptContext);
  bVar2 = ScriptContext::IsJsBuiltInEnabled(scriptContext);
  if (bVar2) {
    pJStack_48 = JavascriptString::NewWithSz(L"CreateArrayIterator",scriptContext);
    n = Js::JavascriptOperators::GetPropertyId(pJStack_48,scriptContext);
    PropertyIds::PropertyIds((PropertyIds *)((long)&scriptFunction + 4),n);
    instance = JavascriptLibrary::GetChakraLib(pJVar4);
    propertyId = PropertyIds::operator_cast_to__E((PropertyIds *)((long)&scriptFunction + 4));
    instance_00 = Js::JavascriptOperators::OP_GetProperty(instance,propertyId,scriptContext);
    BVar3 = Js::JavascriptOperators::IsUndefinedOrNull(instance_00);
    if (BVar3 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                  ,0x658,"(!JavascriptOperators::IsUndefinedOrNull(scriptFunction))"
                                  ,"!JavascriptOperators::IsUndefinedOrNull(scriptFunction)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    bVar2 = JavascriptConversion::IsCallable(instance_00);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                  ,0x659,"(JavascriptConversion::IsCallable(scriptFunction))",
                                  "JavascriptConversion::IsCallable(scriptFunction)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    this = VarTo<Js::RecyclableObject>(instance_00);
    instance_01 = JavascriptLibrary::GetGlobalObject(pJVar4);
    callInfo = (CallInfo)Js::JavascriptOperators::OP_GetProperty(instance_01,0x27a,scriptContext);
    Arguments::operator[](args,0);
    TaggedInt::ToVarUnchecked(kind);
    CallInfo::CallInfo((CallInfo *)&autoReentrancyHandler.m_savedReentrancySafeOrHandled,
                       CallFlags_Value,3);
    threadContext = ScriptContext::GetThreadContext(scriptContext);
    AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_a0,threadContext);
    entryPoint = RecyclableObject::GetEntryPoint(this);
    Arguments::Arguments(local_c0,(CallInfo)autoReentrancyHandler._8_8_,(Var *)&callInfo);
    args_local = (Arguments *)JavascriptFunction::CallFunction<true>(this,entryPoint,local_c0,false)
    ;
    AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_a0);
  }
  else {
    pJVar4 = ScriptContext::GetLibrary(scriptContext);
    args_local = (Arguments *)JavascriptLibrary::CreateArrayIterator(pJVar4,iterable,kind);
  }
  return args_local;
}

Assistant:

Var TypedArrayBase::GetKeysEntriesValuesHelper(Arguments& args, ScriptContext *scriptContext, LPCWSTR apiName, JavascriptArrayIteratorKind kind)
    {
        TypedArrayBase* typedArrayBase = ValidateTypedArray(args, scriptContext, apiName);
#ifdef ENABLE_JS_BUILTINS
        JavascriptLibrary * library = scriptContext->GetLibrary();
        if (scriptContext->IsJsBuiltInEnabled())
        {
            JavascriptString* methodName = JavascriptString::NewWithSz(_u("CreateArrayIterator"), scriptContext);
            PropertyIds functionIdentifier = JavascriptOperators::GetPropertyId(methodName, scriptContext);
            Var scriptFunction = JavascriptOperators::OP_GetProperty(library->GetChakraLib(), functionIdentifier, scriptContext);

            Assert(!JavascriptOperators::IsUndefinedOrNull(scriptFunction));
            Assert(JavascriptConversion::IsCallable(scriptFunction));

            RecyclableObject* function = VarTo<RecyclableObject>(scriptFunction);

            Var chakraLibObj = JavascriptOperators::OP_GetProperty(library->GetGlobalObject(), PropertyIds::__chakraLibrary, scriptContext);
            Var argsIt[] = { chakraLibObj, args[0], TaggedInt::ToVarUnchecked((int)kind) };
            CallInfo callInfo(CallFlags_Value, 3);
            BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
            {
                return JavascriptFunction::CallFunction<true>(function, function->GetEntryPoint(), Js::Arguments(callInfo, argsIt));
            }
            END_SAFE_REENTRANT_CALL
        }
        else
#endif
        return scriptContext->GetLibrary()->CreateArrayIterator(typedArrayBase, kind);
    }